

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_float64_primitive_floor
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_object_tuple_t *floatObject;
  sysbvm_tuple_t sVar2;
  float fVar3;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    fVar3 = *(float *)(uVar1 + 0x10);
  }
  else {
    fVar3 = (float)(uVar1 >> 4);
  }
  fVar3 = floorf(fVar3);
  sVar2 = sysbvm_tuple_float64_encode(context,(double)fVar3);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_floor(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_float64_encode(context, floor(sysbvm_tuple_float32_decode(arguments[0])));
}